

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall Context<true>::PopNamespace(Context<true> *this)

{
  Namespace<true> *__first;
  uchar **ppuVar1;
  reference pvVar2;
  long in_RDI;
  BaseState<true> *return_state;
  char feature_group;
  Namespace<true> *ns;
  uchar *new_ele;
  v_array<unsigned_char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffe0;
  BaseState<true> *pBVar3;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  char cVar4;
  
  __first = CurrentNamespace((Context<true> *)0x266868);
  if (__first->feature_count != 0) {
    cVar4 = __first->feature_group;
    ppuVar1 = v_array<unsigned_char>::begin(*(v_array<unsigned_char> **)(in_RDI + 0x50));
    new_ele = *ppuVar1;
    v_array<unsigned_char>::end(*(v_array<unsigned_char> **)(in_RDI + 0x50));
    in_stack_ffffffffffffffd0 =
         (v_array<unsigned_char> *)
         std::find<unsigned_char*,char>
                   ((uchar *)__first,
                    (uchar *)CONCAT17(cVar4,CONCAT16(in_stack_ffffffffffffffee,
                                                     in_stack_ffffffffffffffe8)),
                    in_stack_ffffffffffffffe0);
    ppuVar1 = v_array<unsigned_char>::end(*(v_array<unsigned_char> **)(in_RDI + 0x50));
    if (in_stack_ffffffffffffffd0 == (v_array<unsigned_char> *)*ppuVar1) {
      v_array<unsigned_char>::push_back(in_stack_ffffffffffffffd0,new_ele);
    }
  }
  pvVar2 = std::vector<Namespace<true>,_std::allocator<Namespace<true>_>_>::back
                     ((vector<Namespace<true>,_std::allocator<Namespace<true>_>_> *)
                      in_stack_ffffffffffffffd0);
  pBVar3 = pvVar2->return_state;
  std::vector<Namespace<true>,_std::allocator<Namespace<true>_>_>::pop_back
            ((vector<Namespace<true>,_std::allocator<Namespace<true>_>_> *)0x266924);
  return pBVar3;
}

Assistant:

BaseState<audit>* PopNamespace()
  {
    auto& ns = CurrentNamespace();
    if (ns.feature_count > 0)
    {
      auto feature_group = ns.feature_group;
      // Do not insert feature_group if it already exists.
      if(std::find(ex->indices.begin(), ex->indices.end(), feature_group) == ex->indices.end())
      {
        ex->indices.push_back(feature_group);
      }
    }

    auto return_state = namespace_path.back().return_state;
    namespace_path.pop_back();
    return return_state;
  }